

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall embree::Scene::commit_task(Scene *this)

{
  _func_int **pp_Var1;
  size_t sVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  task *ptVar8;
  runtime_error *prVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  task_group_context context;
  GeometryCounts v;
  task_group_context context_1;
  undefined1 local_359;
  small_object_pool *local_358;
  Scene *local_350;
  Scene *local_348;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_340;
  Scene **local_338;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_330;
  Scene **local_328;
  task_group_context local_320;
  undefined8 local_2a0;
  undefined4 local_298;
  wait_context local_290 [11];
  undefined1 local_1d8 [12];
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1c8;
  undefined1 local_1c0 [8];
  intrusive_list_node *local_1b8;
  intrusive_list_node *piStack_1b0;
  string_resource_index local_198;
  small_object_pool *local_f8;
  
  checkIfModifiedAndSet(this);
  if (this->modified == true) {
    bVar5 = State::verbosity(*(State **)&(this->super_AccelN).field_0x188,2);
    if (bVar5) {
      printStatistics(this);
    }
    LOCK();
    (this->progress_monitor_counter).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pp_Var1 = (_func_int **)(this->geometries).size_active;
    memset((Scene *)&stack0xffffffffffffff08,0,200);
    local_338 = &local_350;
    local_320.my_version = proxy_support;
    local_320.my_traits = (context_traits)0x4;
    local_320.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_320.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_320.my_name = CUSTOM_CTX;
    local_350 = this;
    local_348 = (Scene *)&stack0xffffffffffffff08;
    local_340.my_parent = (task_group_context *)&local_359;
    tbb::detail::r1::initialize(&local_320);
    unique0x00004e80 = &local_330;
    local_330.my_parent = (task_group_context *)&local_359;
    local_328 = &local_348;
    local_1d8._0_8_ = (Scene *)&stack0xffffffffffffff08;
    local_1c8.my_parent = (task_group_context *)&local_359;
    memcpy(local_1c0,(Scene *)&stack0xffffffffffffff08,200);
    if (pp_Var1 != (_func_int **)0x0) {
      local_2a0 = 0;
      local_298 = 1;
      local_290[0].m_version_and_traits = 1;
      local_290[0].m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      local_358 = (small_object_pool *)0x0;
      ptVar8 = (task *)tbb::detail::r1::allocate(&local_358,0xc0);
      ptVar8->m_reserved[3] = 0;
      ptVar8->m_reserved[4] = 0;
      ptVar8->m_reserved[1] = 0;
      ptVar8->m_reserved[2] = 0;
      (ptVar8->super_task_traits).m_version_and_traits = 0;
      ptVar8->m_reserved[0] = 0;
      ptVar8->m_reserved[5] = 0;
      ptVar8->_vptr_task = (_func_int **)&PTR__task_021858f0;
      ptVar8[1]._vptr_task = pp_Var1;
      ptVar8[1].super_task_traits.m_version_and_traits = 0;
      ptVar8[1].m_reserved[0] = 1;
      ptVar8[1].m_reserved[1] = (uint64_t)local_1d8;
      iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)(ptVar8[1].m_reserved + 4) = 0;
      *(undefined1 *)((long)ptVar8[1].m_reserved + 0x24) = 5;
      ptVar8[1].m_reserved[3] = (long)iVar7 * 2 & 0x7ffffffffffffffe;
      ptVar8[1].m_reserved[5] = (uint64_t)local_358;
      *(undefined1 *)&ptVar8[2]._vptr_task = 0;
      ptVar8[1].m_reserved[2] = (uint64_t)&local_2a0;
      tbb::detail::r1::execute_and_wait(ptVar8,&local_320,local_290,&local_320);
    }
    memcpy(&local_2a0,local_1c0,200);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_320);
    if (cVar6 != '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"task cancelled");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_320);
    memcpy(&this->world,&local_2a0,200);
    this->maxTimeSegments = 1;
    sVar2 = (this->geometries).size_active;
    if (sVar2 != 0) {
      pRVar3 = (this->geometries).items;
      uVar10 = 1;
      sVar11 = 0;
      do {
        pGVar4 = pRVar3[sVar11].ptr;
        if (pGVar4 != (Geometry *)0x0) {
          uVar12 = pGVar4->numTimeSteps - 1;
          if (uVar10 <= uVar12) {
            uVar10 = uVar12;
          }
          this->maxTimeSegments = uVar10;
        }
        sVar11 = sVar11 + 1;
      } while (sVar2 != sVar11);
    }
    build_cpu_accels(this);
    pp_Var1 = (_func_int **)(this->geometries).size_active;
    uStack_1cc = 0x401;
    local_1b8 = (intrusive_list_node *)0x0;
    piStack_1b0 = (intrusive_list_node *)0x0;
    local_198 = CUSTOM_CTX;
    local_348 = this;
    tbb::detail::r1::initialize((task_group_context *)local_1d8);
    local_320.my_cpu_ctl_env = (uint64_t)&local_348;
    if (pp_Var1 != (_func_int **)0x0) {
      local_f8 = (small_object_pool *)0x0;
      ptVar8 = (task *)tbb::detail::r1::allocate(&stack0xffffffffffffff08,0xc0);
      ptVar8->m_reserved[3] = 0;
      ptVar8->m_reserved[4] = 0;
      ptVar8->m_reserved[1] = 0;
      ptVar8->m_reserved[2] = 0;
      (ptVar8->super_task_traits).m_version_and_traits = 0;
      ptVar8->m_reserved[0] = 0;
      ptVar8->m_reserved[5] = 0;
      ptVar8->_vptr_task = (_func_int **)&PTR__task_02185938;
      ptVar8[1]._vptr_task = pp_Var1;
      ptVar8[1].super_task_traits.m_version_and_traits = 0;
      ptVar8[1].m_reserved[0] = 1;
      ptVar8[1].m_reserved[1] = (uint64_t)&local_320;
      ptVar8[1].m_reserved[2] = 0;
      ptVar8[1].m_reserved[3] = 1;
      iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar8[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar8[2]._vptr_task + 4) = 5;
      ptVar8[1].m_reserved[5] = (long)iVar7 * 2 & 0x7ffffffffffffffe;
      ptVar8[2].super_task_traits.m_version_and_traits = (uint64_t)local_f8;
      local_2a0 = 0;
      local_298 = 1;
      local_290[0].m_version_and_traits = 1;
      local_290[0].m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar8[1].m_reserved[4] = (uint64_t)&local_2a0;
      tbb::detail::r1::execute_and_wait
                (ptVar8,(task_group_context *)local_1d8,local_290,(task_group_context *)local_1d8);
    }
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1d8);
    if (cVar6 != '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"task cancelled");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_1d8);
    this->modified = false;
  }
  return;
}

Assistant:

void Scene::commit_task ()
  {
    checkIfModifiedAndSet();
    if (!isModified()) return;
    

    /* print scene statistics */
    if (device->verbosity(2))
      printStatistics();

    progress_monitor_counter = 0;
    
    /* gather scene stats and call preCommit function of each geometry */
    this->world = parallel_reduce (size_t(0), geometries.size(), GeometryCounts (), 
      [this](const range<size_t>& r)->GeometryCounts
      {
        GeometryCounts c;
        for (auto i=r.begin(); i<r.end(); ++i) 
        {
          if (geometries[i] && geometries[i]->isEnabled()) 
          {
            geometries[i]->preCommit();
            geometries[i]->addElementsToCount (c);
            c.numFilterFunctions += (int) geometries[i]->hasArgumentFilterFunctions();
            c.numFilterFunctions += (int) geometries[i]->hasGeometryFilterFunctions();
          }
        }
        return c;
      },
      std::plus<GeometryCounts>()
    );

    /* calculate maximal number of motion blur time segments in scene */
    maxTimeSegments = 1;
    for (size_t geomID=0; geomID<size(); geomID++)
    {
      Geometry* geom = get(geomID);
      if (geom == nullptr) continue;
      maxTimeSegments = std::max(maxTimeSegments, geom->numTimeSegments());
    }

#if defined(EMBREE_SYCL_SUPPORT)
    DeviceGPU* gpu_device = dynamic_cast<DeviceGPU*>(device);
    if (gpu_device)
      build_gpu_accels();
    else
#endif
      build_cpu_accels();

    /* call postCommit function of each geometry */
    parallel_for(geometries.size(), [&] ( const size_t i ) {
        if (geometries[i] && geometries[i]->isEnabled()) {
          geometries[i]->postCommit();
          vertices[i] = geometries[i]->getCompactVertexArray();
          geometryModCounters_[i] = geometries[i]->getModCounter();
        }
      });

    setModified(false);
  }